

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  TestResult *pTVar1;
  ostream *poVar2;
  internal *piVar3;
  size_t in_RDX;
  size_t width;
  size_t width_00;
  size_t extraout_RDX;
  size_t width_01;
  size_t width_02;
  size_t width_03;
  size_t width_04;
  TimeInMillis ms;
  size_t width_05;
  TimeInMillis ms_00;
  size_t width_06;
  size_t extraout_RDX_00;
  size_t width_07;
  size_t width_08;
  size_t width_09;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  string local_380;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  string local_38;
  TestResult *local_18;
  TestResult *result_local;
  ostream *stream_local;
  
  local_18 = result;
  result_local = (TestResult *)stream;
  Indent_abi_cxx11_(&local_38,(internal *)0x4,in_RDX);
  poVar2 = std::operator<<(stream,(string *)&local_38);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::~string((string *)&local_38);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"testsuite",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"name",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"NonTestSuiteFailure",&local_b9);
  Indent_abi_cxx11_(&local_e0,(internal *)0x6,width);
  OutputJsonKey((ostream *)pTVar1,&local_68,&local_90,&local_b8,&local_e0,true);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"testsuite",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"tests",&local_129);
  Indent_abi_cxx11_(&local_150,(internal *)0x6,width_00);
  OutputJsonKey((ostream *)pTVar1,&local_100,&local_128,1,&local_150,true);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  pTVar1 = result_local;
  width_07 = extraout_RDX;
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"testsuite",&local_171);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"failures",&local_199);
    Indent_abi_cxx11_(&local_1c0,(internal *)0x6,width_01);
    OutputJsonKey((ostream *)pTVar1,&local_170,&local_198,1,&local_1c0,true);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    pTVar1 = result_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"testsuite",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"disabled",&local_209);
    Indent_abi_cxx11_(&local_230,(internal *)0x6,width_02);
    OutputJsonKey((ostream *)pTVar1,&local_1e0,&local_208,0,&local_230,true);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    pTVar1 = result_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"testsuite",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"skipped",&local_279);
    Indent_abi_cxx11_(&local_2a0,(internal *)0x6,width_03);
    OutputJsonKey((ostream *)pTVar1,&local_250,&local_278,0,&local_2a0,true);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    pTVar1 = result_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"testsuite",&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"errors",&local_2e9);
    Indent_abi_cxx11_(&local_310,(internal *)0x6,width_04);
    OutputJsonKey((ostream *)pTVar1,&local_2c0,&local_2e8,0,&local_310,true);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    pTVar1 = result_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"testsuite",&local_331);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"time",&local_359);
    piVar3 = (internal *)TestResult::elapsed_time(local_18);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_380,piVar3,ms);
    Indent_abi_cxx11_(&local_3a0,(internal *)0x6,width_05);
    OutputJsonKey((ostream *)pTVar1,&local_330,&local_358,&local_380,&local_3a0,true);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator(&local_331);
    pTVar1 = result_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"testsuite",&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"timestamp",&local_3e9);
    piVar3 = (internal *)TestResult::start_timestamp(local_18);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_410,piVar3,ms_00);
    Indent_abi_cxx11_(&local_430,(internal *)0x6,width_06);
    OutputJsonKey((ostream *)pTVar1,&local_3c0,&local_3e8,&local_410,&local_430,true);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
    width_07 = extraout_RDX_00;
  }
  pTVar1 = result_local;
  Indent_abi_cxx11_(&local_450,(internal *)0x6,width_07);
  poVar2 = std::operator<<((ostream *)pTVar1,(string *)&local_450);
  std::operator<<(poVar2,"\"testsuite\": [\n");
  std::__cxx11::string::~string((string *)&local_450);
  OutputJsonTestCaseForTestResult((ostream *)result_local,local_18);
  poVar2 = std::operator<<((ostream *)result_local,"\n");
  Indent_abi_cxx11_(&local_470,(internal *)0x6,width_08);
  poVar2 = std::operator<<(poVar2,(string *)&local_470);
  poVar2 = std::operator<<(poVar2,"]\n");
  Indent_abi_cxx11_(&local_490,(internal *)0x4,width_09);
  poVar2 = std::operator<<(poVar2,(string *)&local_490);
  std::operator<<(poVar2,"}");
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a new test suite.
  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, "testsuite", "name", "NonTestSuiteFailure", Indent(6));
  OutputJsonKey(stream, "testsuite", "tests", 1, Indent(6));
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, "testsuite", "failures", 1, Indent(6));
    OutputJsonKey(stream, "testsuite", "disabled", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "skipped", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "errors", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "time",
                  FormatTimeInMillisAsDuration(result.elapsed_time()),
                  Indent(6));
    OutputJsonKey(stream, "testsuite", "timestamp",
                  FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                  Indent(6));
  }
  *stream << Indent(6) << "\"testsuite\": [\n";

  OutputJsonTestCaseForTestResult(stream, result);

  // Finish the test suite.
  *stream << "\n" << Indent(6) << "]\n" << Indent(4) << "}";
}